

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.c
# Opt level: O3

void push_elements_key(uchar **cursor,size_t *max,uint64_t type)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  
  sVar1 = varint_get_length(0xfc);
  sVar2 = varint_get_length(8);
  sVar3 = varint_get_length(type);
  push_varint(cursor,max,sVar3 + sVar2 + sVar1 + 8);
  push_varint(cursor,max,0xfc);
  push_varbuff(cursor,max,"elements",8);
  push_varint(cursor,max,type);
  return;
}

Assistant:

static void push_elements_key(unsigned char **cursor, size_t *max,
                              uint64_t type)
{
    push_varint(cursor, max, varint_get_length(PSBT_PROPRIETARY_TYPE)
                + varint_get_length(sizeof(PSET_KEY_PREFIX))
                + sizeof(PSET_KEY_PREFIX) + varint_get_length(type));
    push_varint(cursor, max, PSBT_PROPRIETARY_TYPE);
    push_varbuff(cursor, max, PSET_KEY_PREFIX, sizeof(PSET_KEY_PREFIX));
    push_varint(cursor, max, type);
}